

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinkedList.h
# Opt level: O2

void __thiscall LinkedList<Transaction_*>::~LinkedList(LinkedList<Transaction_*> *this)

{
  Node<Transaction_*> *pNVar1;
  Node<Transaction_*> *pNVar2;
  Node<Transaction_*> *pNVar3;
  int i;
  int iVar4;
  
  pNVar2 = this->head;
  pNVar3 = this->head->next;
  for (iVar4 = 0; iVar4 < this->size; iVar4 = iVar4 + 1) {
    operator_delete(pNVar2,0x10);
    if (pNVar3 == (Node<Transaction_*> *)0x0) {
      pNVar1 = (Node<Transaction_*> *)0x0;
    }
    else {
      pNVar1 = pNVar3->next;
    }
    pNVar2 = pNVar3;
    pNVar3 = pNVar1;
  }
  return;
}

Assistant:

LinkedList<T>::~LinkedList()
{
    auto curr = this->head;
    auto currNext = curr->next;

    for(int i = 0; i < size; i++)
    {
        delete curr;
        curr = currNext;
        if(curr != nullptr)
        {
            currNext = curr->next;
        }
    }
}